

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightfield_tile_list_decoder.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  AvxVideoReader *pAVar3;
  ulong uVar4;
  aom_codec_err_t aVar5;
  int iVar6;
  uint uVar7;
  FILE *__s;
  long lVar8;
  AvxVideoInfo *pAVar9;
  aom_codec_iface_t *iface;
  char *pcVar10;
  uint8_t *puVar11;
  aom_image_t *paVar12;
  aom_image_t *paVar13;
  FILE *__stream;
  byte bVar14;
  int iVar15;
  char *fmt;
  ulong uVar16;
  uchar *__ptr;
  uint uVar17;
  long lVar18;
  aom_codec_iter_t iter;
  size_t frame_size;
  uint tile_size;
  aom_codec_ctx_t codec;
  av1_ext_ref_frame_t set_ext_ref;
  aom_image_t reference_images [128];
  aom_codec_iter_t local_58d8;
  int local_58d0;
  uint local_58cc;
  size_t local_58c8;
  AvxVideoReader *local_58c0;
  ulong local_58b8;
  uint local_58b0;
  uint local_58ac;
  long local_58a8;
  ulong local_58a0;
  aom_image_t *local_5898;
  uint local_5890;
  uint local_588c;
  uint local_5888;
  uint local_5884;
  long local_5880;
  long local_5878;
  aom_codec_ctx_t local_5870;
  undefined8 local_5838;
  undefined4 local_5830;
  aom_image_t local_5438 [128];
  
  local_58c8 = 0;
  exec_name = *argv;
  if (argc < 5) {
    pcVar10 = "Invalid number of arguments.";
LAB_0011e764:
    die(pcVar10);
  }
  local_58c0 = aom_video_reader_open(argv[1]);
  if (local_58c0 == (AvxVideoReader *)0x0) {
    pcVar10 = argv[1];
    fmt = "Failed to open %s for reading.";
  }
  else {
    __s = fopen64(argv[2],"wb");
    if (__s != (FILE *)0x0) {
      lVar8 = 0;
      local_58a8 = strtol(argv[3],(char **)0x0,0);
      local_5878 = strtol(argv[4],(char **)0x0,0);
      if ((argc == 5) || (lVar8 = strtol(argv[5],(char **)0x0,0), (uint)lVar8 < 3)) {
        pAVar9 = aom_video_reader_get_info(local_58c0);
        iface = get_aom_decoder_by_fourcc(pAVar9->codec_fourcc);
        if (iface == (aom_codec_iface_t *)0x0) {
          pcVar10 = "Unknown input codec.";
        }
        else {
          pcVar10 = aom_codec_iface_name(iface);
          printf("Using %s\n",pcVar10);
          aVar5 = aom_codec_dec_init_ver(&local_5870,iface,(aom_codec_dec_cfg_t *)0x0,0,0x16);
          if (aVar5 == AOM_CODEC_OK) {
            local_5880 = lVar8;
            aVar5 = aom_codec_control(&local_5870,0x116,(ulong)pAVar9->is_annexb);
            if (aVar5 == AOM_CODEC_OK) {
              aom_codec_control(&local_5870,0x110,0);
              uVar16 = local_58b8;
              if (0 < (int)(uint)local_58a8) {
                local_58a0 = (ulong)((uint)local_58a8 & 0x7fffffff);
                local_58b8 = 0;
                do {
                  pAVar3 = local_58c0;
                  aom_video_reader_read_frame(local_58c0);
                  puVar11 = aom_video_reader_get_frame(pAVar3,&local_58c8);
                  aVar5 = aom_codec_decode(&local_5870,puVar11,local_58c8,(void *)0x0);
                  if (aVar5 != AOM_CODEC_OK) {
                    pcVar10 = "Failed to decode frame.";
                    goto LAB_0011e6fe;
                  }
                  if (local_58b8 == 0) {
                    local_58d8 = (aom_codec_iter_t)((ulong)local_58d8 & 0xffffffff00000000);
                    aVar5 = aom_codec_control(&local_5870,0x106,&local_58d8);
                    if (aVar5 != AOM_CODEC_OK) {
                      pcVar10 = "Failed to get the image format";
                      goto LAB_0011e6fe;
                    }
                    aVar5 = aom_codec_control(&local_5870,0x103,&local_5838);
                    if (aVar5 != AOM_CODEC_OK) {
                      pcVar10 = "Failed to get the image frame size";
                      goto LAB_0011e6fe;
                    }
                    paVar13 = local_5438;
                    uVar16 = local_58a0;
                    do {
                      paVar12 = aom_img_alloc_with_border
                                          (paVar13,(aom_img_fmt_t)local_58d8,(uint)local_5838,
                                           local_5838._4_4_,0x20,8,0x40);
                      if (paVar12 == (aom_image_t *)0x0) {
                        fatal("Failed to allocate references.");
                      }
                      paVar13 = paVar13 + 1;
                      uVar16 = uVar16 - 1;
                    } while (uVar16 != 0);
                  }
                  aVar5 = aom_codec_control(&local_5870,0xea,local_5438 + local_58b8);
                  if (aVar5 != AOM_CODEC_OK) {
                    pcVar10 = "Failed to copy decoded reference frame";
                    goto LAB_0011e6fe;
                  }
                  local_58d8 = (aom_codec_iter_t)0x0;
                  paVar13 = aom_codec_get_frame(&local_5870,&local_58d8);
                  uVar4 = local_58b8;
                  uVar16 = local_58b8;
                  while (paVar13 != (aom_image_t *)0x0) {
                    local_58b8 = uVar16;
                    snprintf((char *)&local_5838,0x400,"ref_%d.yuv",uVar4 & 0xffffffff);
                    printf("writing ref image to %s, %u, %u\n",&local_5838,(ulong)paVar13->d_w);
                    __stream = fopen64((char *)&local_5838,"wb");
                    aom_img_write(paVar13,(FILE *)__stream);
                    fclose(__stream);
                    paVar13 = aom_codec_get_frame(&local_5870,&local_58d8);
                    uVar16 = local_58b8;
                  }
                  local_58b8 = uVar4 + 1;
                } while (local_58b8 != local_58a0);
              }
              local_58b8 = uVar16;
              aom_codec_control(&local_5870,0x110,1);
              local_5838 = local_5438;
              local_5830 = (undefined4)local_58a8;
              aom_codec_control(&local_5870,0x113);
              pAVar3 = local_58c0;
              aom_video_reader_read_frame(local_58c0);
              puVar11 = aom_video_reader_get_frame(pAVar3,&local_58c8);
              aVar5 = aom_codec_decode(&local_5870,puVar11,local_58c8,(void *)0x0);
              if (aVar5 == AOM_CODEC_OK) {
                if (0 < (int)local_5878) {
                  iVar6 = 0;
                  lVar8 = local_5878;
                  lVar18 = local_5880;
                  do {
                    pAVar3 = local_58c0;
                    local_58d0 = iVar6;
                    aom_video_reader_read_frame(local_58c0);
                    puVar11 = aom_video_reader_get_frame(pAVar3,&local_58c8);
                    aVar5 = aom_codec_decode(&local_5870,puVar11,local_58c8,(void *)0x0);
                    if (aVar5 != AOM_CODEC_OK) {
                      pcVar10 = "Failed to decode the tile list.";
                      goto LAB_0011e6fe;
                    }
                    local_58d8 = (aom_codec_iter_t)0x0;
                    paVar13 = aom_codec_get_frame(&local_5870,&local_58d8);
                    if (paVar13 == (aom_image_t *)0x0) {
                      pcVar10 = "Failed to get frame.";
                      goto LAB_0011e6fe;
                    }
                    if ((int)lVar18 == 1) {
                      aom_img_write(paVar13,(FILE *)__s);
                    }
                    else {
                      if ((int)lVar18 == 0) {
                        local_58ac = 0;
                        local_5898 = paVar13;
                        aVar5 = aom_codec_control(&local_5870,0x107,&local_58ac);
                        uVar7 = local_58ac;
                        if (aVar5 == AOM_CODEC_OK) {
                          local_58b0 = local_58ac >> 0x10;
                          local_5890 = local_5898->d_w / local_58b0;
                          local_58cc = 0;
                          aVar5 = aom_codec_control(&local_5870,0x108,&local_58cc);
                          if (aVar5 == AOM_CODEC_OK) {
                            lVar8 = local_5878;
                            lVar18 = local_5880;
                            if (local_58cc != 0) {
                              local_5884 = uVar7 & 0xffff;
                              local_5888 = local_5898->fmt >> 0xb & 1;
                              uVar7 = 0;
                              do {
                                iVar6 = (uVar7 / local_5890) * local_5884;
                                iVar15 = (uVar7 % local_5890) * local_58b0;
                                lVar8 = 0;
                                local_58b8 = CONCAT44(local_58b8._4_4_,iVar15);
                                local_58a0 = CONCAT44(local_58a0._4_4_,iVar6);
                                local_588c = uVar7;
                                do {
                                  iVar2 = local_5898->stride[lVar8];
                                  uVar17 = local_58b0;
                                  uVar7 = local_5884;
                                  if (lVar8 != 0) {
                                    bVar14 = (byte)local_5898->x_chroma_shift;
                                    bVar1 = (byte)local_5898->y_chroma_shift;
                                    iVar6 = iVar6 >> (bVar1 & 0x1f);
                                    iVar15 = iVar15 >> (bVar14 & 0x1f);
                                    uVar17 = local_58b0 >> (bVar14 & 0x1f);
                                    uVar7 = local_5884 >> (bVar1 & 0x1f);
                                  }
                                  if (0 < (int)uVar7) {
                                    bVar14 = (byte)local_5888;
                                    __ptr = local_5898->planes[lVar8] +
                                            (iVar6 * iVar2 + (iVar15 << (bVar14 & 0x1f)));
                                    do {
                                      fwrite(__ptr,1,(ulong)(uVar17 << (bVar14 & 0x1f)),__s);
                                      __ptr = __ptr + iVar2;
                                      uVar7 = uVar7 - 1;
                                    } while (uVar7 != 0);
                                  }
                                  lVar8 = lVar8 + 1;
                                  iVar6 = (int)local_58a0;
                                  iVar15 = (int)local_58b8;
                                } while (lVar8 != 3);
                                uVar7 = local_588c + 1;
                                lVar8 = local_5878;
                                lVar18 = local_5880;
                              } while (uVar7 < local_58cc);
                            }
                            goto LAB_0011e641;
                          }
                        }
                        pcVar10 = "Failed to get the tile size";
                        goto LAB_0011e6fe;
                      }
                      aom_img_write_nv12(paVar13,(FILE *)__s);
                    }
LAB_0011e641:
                    iVar6 = local_58d0 + 1;
                  } while (iVar6 != (int)lVar8);
                }
                paVar13 = local_5438;
                if (0 < (int)(uint)local_58a8) {
                  uVar16 = (ulong)((uint)local_58a8 & 0x7fffffff);
                  do {
                    aom_img_free(paVar13);
                    paVar13 = paVar13 + 1;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                aVar5 = aom_codec_destroy(&local_5870);
                if (aVar5 == AOM_CODEC_OK) {
                  aom_video_reader_close(local_58c0);
                  fclose(__s);
                  return 0;
                }
                pcVar10 = "Failed to destroy codec";
              }
              else {
                pcVar10 = "Failed to decode the frame.";
              }
            }
            else {
              pcVar10 = "Failed to set annex b status";
            }
LAB_0011e6fe:
            die_codec(&local_5870,pcVar10);
          }
          pcVar10 = "Failed to initialize decoder.";
        }
      }
      else {
        pcVar10 = "Output format out of range [0, 2]";
      }
      goto LAB_0011e764;
    }
    pcVar10 = argv[2];
    fmt = "Failed to open %s for writing.";
  }
  die(fmt,pcVar10);
}

Assistant:

int main(int argc, char **argv) {
  FILE *outfile = NULL;
  AvxVideoReader *reader = NULL;
  const AvxVideoInfo *info = NULL;
  int num_references;
  int num_tile_lists;
  aom_image_t reference_images[MAX_EXTERNAL_REFERENCES];
  size_t frame_size = 0;
  const unsigned char *frame = NULL;
  int output_format = YUV1D;
  int i, j, n;

  exec_name = argv[0];

  if (argc < 5) die("Invalid number of arguments.");

  reader = aom_video_reader_open(argv[1]);
  if (!reader) die("Failed to open %s for reading.", argv[1]);

  if (!(outfile = fopen(argv[2], "wb")))
    die("Failed to open %s for writing.", argv[2]);

  num_references = (int)strtol(argv[3], NULL, 0);
  num_tile_lists = (int)strtol(argv[4], NULL, 0);

  if (argc > 5) output_format = (int)strtol(argv[5], NULL, 0);
  if (output_format < YUV1D || output_format > NV12)
    die("Output format out of range [0, 2]");

  info = aom_video_reader_get_info(reader);

  aom_codec_iface_t *decoder = get_aom_decoder_by_fourcc(info->codec_fourcc);
  if (!decoder) die("Unknown input codec.");
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_IS_ANNEXB,
                                    info->is_annexb)) {
    die_codec(&codec, "Failed to set annex b status");
  }

  // Decode anchor frames.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 0);
  for (i = 0; i < num_references; ++i) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);
    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode frame.");

    if (i == 0) {
      aom_img_fmt_t ref_fmt = 0;
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_IMG_FORMAT, &ref_fmt))
        die_codec(&codec, "Failed to get the image format");

      int frame_res[2];
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_FRAME_SIZE, frame_res))
        die_codec(&codec, "Failed to get the image frame size");

      // Allocate memory to store decoded references. Allocate memory with the
      // border so that it can be used as a reference.
      for (j = 0; j < num_references; j++) {
        unsigned int border = AOM_DEC_BORDER_IN_PIXELS;
        if (!aom_img_alloc_with_border(&reference_images[j], ref_fmt,
                                       frame_res[0], frame_res[1], 32, 8,
                                       border)) {
          fatal("Failed to allocate references.");
        }
      }
    }

    if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_COPY_NEW_FRAME_IMAGE,
                                      &reference_images[i]))
      die_codec(&codec, "Failed to copy decoded reference frame");

    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      char name[1024];
      snprintf(name, sizeof(name), "ref_%d.yuv", i);
      printf("writing ref image to %s, %u, %u\n", name, img->d_w, img->d_h);
      FILE *ref_file = fopen(name, "wb");
      aom_img_write(img, ref_file);
      fclose(ref_file);
    }
  }

  // Decode the lightfield.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 1);

  // Set external references.
  av1_ext_ref_frame_t set_ext_ref = { &reference_images[0], num_references };
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_EXT_REF_PTR, &set_ext_ref);
  // Must decode the camera frame header first.
  aom_video_reader_read_frame(reader);
  frame = aom_video_reader_get_frame(reader, &frame_size);
  if (aom_codec_decode(&codec, frame, frame_size, NULL))
    die_codec(&codec, "Failed to decode the frame.");
  // Decode tile lists one by one.
  for (n = 0; n < num_tile_lists; n++) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);

    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode the tile list.");
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = aom_codec_get_frame(&codec, &iter);
    if (!img) die_codec(&codec, "Failed to get frame.");

    if (output_format == YUV1D)
      // write the tile to the output file in 1D format.
      write_tile_yuv1d(&codec, img, outfile);
    else if (output_format == YUV)
      aom_img_write(img, outfile);
    else
      // NV12 output format
      aom_img_write_nv12(img, outfile);
  }

  for (i = 0; i < num_references; i++) aom_img_free(&reference_images[i]);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");
  aom_video_reader_close(reader);
  fclose(outfile);

  return EXIT_SUCCESS;
}